

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout_p.h
# Opt level: O2

QRgba64 qRepremultiply<14u>(QRgba64 p)

{
  QRgba64 QVar1;
  long in_FS_OFFSET;
  QRgba64 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.rgba = p.rgba;
  if (1 < (ushort)((short)(p.rgba >> 0x30) + 1U)) {
    QVar1 = QRgba64::unpremultiplied(&local_20);
    local_20.rgba = (ulong)((uint)(p.rgba >> 0x3e) * 0x5555) << 0x30 | QVar1.rgba & 0xffffffffffff;
    p = QRgba64::premultiplied(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QRgba64)p.rgba;
  }
  __stack_chk_fail();
}

Assistant:

inline QRgba64 qRepremultiply(QRgba64 p)
{
    const uint alpha = p.alpha();
    if (alpha == 65535 || alpha == 0)
        return p;
    p = p.unpremultiplied();
    constexpr  uint mult = 65535 / (65535 >> Shift);
    p.setAlpha(mult * (alpha >> Shift));
    return p.premultiplied();
}